

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::RefreshSingleLine(Linenoise *this)

{
  bool bVar1;
  int iVar2;
  size_t *render_pos_00;
  uint uVar3;
  long in_RDI;
  AppendBuffer append_buffer;
  string highlight_buffer;
  size_t render_pos;
  size_t render_len;
  char *render_buf;
  int fd;
  size_t plen;
  char seq [64];
  char *s;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff3c;
  AppendBuffer *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff64;
  AppendBuffer *in_stack_ffffffffffffff68;
  Linenoise *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff87;
  size_t in_stack_ffffffffffffff88;
  int iVar4;
  size_t cols;
  size_t pos;
  size_t *len;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  int iVar6;
  char local_48 [8];
  string *in_stack_ffffffffffffffc0;
  searchMatch *in_stack_ffffffffffffffd0;
  
  iVar2 = GetPromptWidth((Linenoise *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
  ;
  render_pos_00 = (size_t *)(long)iVar2;
  uVar5 = *(undefined4 *)(in_RDI + 4);
  len = *(size_t **)(in_RDI + 8);
  pos = *(size_t *)(in_RDI + 0x38);
  cols = 0;
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff70);
  bVar1 = Highlighting::IsEnabled();
  iVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
  uVar3 = (uint)bVar1;
  s = &stack0xffffffffffffff70;
  renderText(render_pos_00,(char **)CONCAT44(uVar5,in_stack_ffffffffffffffa8),len,pos,cols,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffff87,
             in_stack_ffffffffffffffd0);
  iVar6 = (int)render_pos_00;
  iVar4 = (int)cols;
  AppendBuffer::AppendBuffer((AppendBuffer *)0x20117d);
  AppendBuffer::Append((AppendBuffer *)CONCAT44(in_stack_fffffffffffffef4,uVar3),s);
  AppendBuffer::Append((AppendBuffer *)CONCAT44(in_stack_fffffffffffffef4,uVar3),s);
  AppendBuffer::Append((AppendBuffer *)CONCAT44(in_stack_fffffffffffffef4,uVar3),s,0x2011bf);
  RefreshShowHints(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  AppendBuffer::Append((AppendBuffer *)CONCAT44(in_stack_fffffffffffffef4,uVar3),s);
  snprintf(local_48,0x40,"\r\x1b[%dC",(ulong)(uint)(iVar4 + iVar6));
  AppendBuffer::Append((AppendBuffer *)CONCAT44(in_stack_fffffffffffffef4,uVar3),s);
  AppendBuffer::Write(in_stack_ffffffffffffff40,iVar2);
  AppendBuffer::~AppendBuffer((AppendBuffer *)0x20124a);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  return;
}

Assistant:

void Linenoise::RefreshSingleLine() const {
	char seq[64];
	size_t plen = GetPromptWidth();
	int fd = ofd;
	char *render_buf = buf;
	size_t render_len = len;
	size_t render_pos = 0;
	std::string highlight_buffer;

	renderText(render_pos, render_buf, render_len, pos, ws.ws_col, plen, highlight_buffer, Highlighting::IsEnabled());

	AppendBuffer append_buffer;
	/* Cursor to left edge */
	append_buffer.Append("\r");
	/* Write the prompt and the current buffer content */
	append_buffer.Append(prompt);
	append_buffer.Append(render_buf, render_len);
	/* Show hits if any. */
	RefreshShowHints(append_buffer, plen);
	/* Erase to right */
	append_buffer.Append("\x1b[0K");
	/* Move cursor to original position. */
	snprintf(seq, 64, "\r\x1b[%dC", (int)(render_pos + plen));
	append_buffer.Append(seq);
	append_buffer.Write(fd);
}